

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dataset_metadata.cpp
# Opt level: O3

void __thiscall
dlib::image_dataset_metadata::doc_handler::start_element
          (doc_handler *this,unsigned_long line_number,string *name,attribute_list *atts)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
  *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  gender_t gVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  long lVar6;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  const_iterator cVar7;
  undefined4 extraout_var_15;
  mapped_type *pmVar8;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  error *peVar9;
  undefined4 extraout_var_18;
  long *plVar10;
  _func_int **pp_Var11;
  double dVar12;
  undefined1 auVar13 [16];
  ostringstream sout;
  undefined1 local_220 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [22];
  string local_a8;
  long local_88;
  long local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  unsigned_long local_58;
  
  local_58 = line_number;
  if ((this->ts).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->ts).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_220,"Invalid XML document.  Root tag must be <dataset>.  Found <",
                 0x3b);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_220,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"> instead.",10);
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      error::error(peVar9,&local_a8);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    goto LAB_002021a6;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    pp_Var11 = (_func_int **)(local_220 + 0x10);
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"top","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 == '\0') {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"<box> missing required attribute \'top\'","");
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"top","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[10])(atts,local_220);
    lVar6 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar3));
    (this->temp_box).rect.t = lVar6;
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"left","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 == '\0') {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"<box> missing required attribute \'left\'","");
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"left","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[10])(atts,local_220);
    lVar6 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_00,iVar3));
    (this->temp_box).rect.l = lVar6;
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"width","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 == '\0') {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"<box> missing required attribute \'width\'","");
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"width","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[10])(atts,local_220);
    lVar6 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_01,iVar3));
    (this->temp_box).rect.r = lVar6;
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"height","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 == '\0') {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"<box> missing required attribute \'height\'","");
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"height","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[10])(atts,local_220);
    lVar6 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_02,iVar3));
    (this->temp_box).rect.b = lVar6;
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"difficult","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"difficult","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      bVar2 = string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_03,iVar3));
      (this->temp_box).difficult = bVar2;
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"truncated","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"truncated","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      bVar2 = string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_04,iVar3));
      (this->temp_box).truncated = bVar2;
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"occluded","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"occluded","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      bVar2 = string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_05,iVar3));
      (this->temp_box).occluded = bVar2;
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"ignore","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"ignore","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      bVar2 = string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_06,iVar3));
      (this->temp_box).ignore = bVar2;
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"angle","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"angle","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      dVar12 = string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var_07,iVar3));
      (this->temp_box).angle = dVar12;
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"age","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"age","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      dVar12 = string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var_08,iVar3));
      (this->temp_box).age = dVar12;
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"gender","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"gender","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      iVar3 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_09,iVar3));
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
      if (iVar3 == 0) {
        gVar4 = MALE;
      }
      else {
        local_220._0_8_ = pp_Var11;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"gender","");
        iVar3 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,local_220);
        iVar3 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_10,iVar3));
        if ((_func_int **)local_220._0_8_ != pp_Var11) {
          operator_delete((void *)local_220._0_8_);
        }
        if (iVar3 == 0) {
          gVar4 = FEMALE;
        }
        else {
          local_220._0_8_ = pp_Var11;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"gender","");
          iVar3 = (*(atts->
                    super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._vptr_enumerable[10])(atts,local_220);
          iVar3 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_11,iVar3));
          if ((_func_int **)local_220._0_8_ != pp_Var11) {
            operator_delete((void *)local_220._0_8_);
          }
          gVar4 = UNKNOWN;
          if (iVar3 != 0) {
            peVar9 = (error *)__cxa_allocate_exception(0x30);
            local_220._0_8_ = pp_Var11;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_220,"Invalid gender string in box attribute.","");
            error::error(peVar9,(string *)local_220);
            __cxa_throw(peVar9,&error::typeinfo,error::~error);
          }
        }
      }
      (this->temp_box).gender = gVar4;
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"pose","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"pose","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      dVar12 = string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var_16,iVar3));
      (this->temp_box).pose = dVar12;
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"detection_score","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 != '\0') {
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"detection_score","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_220);
      dVar12 = string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var_17,iVar3));
      (this->temp_box).detection_score = dVar12;
      if ((_func_int **)local_220._0_8_ != pp_Var11) {
        operator_delete((void *)local_220._0_8_);
      }
    }
    lVar6 = (this->temp_box).rect.t;
    lVar1 = (this->temp_box).rect.b;
    auVar13._8_4_ = 0xffffffff;
    auVar13._0_8_ = 0xffffffffffffffff;
    auVar13._12_4_ = 0xffffffff;
    (this->temp_box).rect.r = (this->temp_box).rect.r + (this->temp_box).rect.l + -1;
    (this->temp_box).rect.b = auVar13._8_8_ + lVar1 + lVar6;
    goto LAB_002021a6;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 == 0) {
    iVar3 = std::__cxx11::string::compare
                      ((char *)((this->ts).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -1));
    if (iVar3 != 0) goto LAB_00201610;
    pp_Var11 = (_func_int **)(local_220 + 0x10);
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"x","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 == '\0') {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"<part> missing required attribute \'x\'","");
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"x","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[10])(atts,local_220);
    lVar6 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var_12,iVar3));
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"y","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 == '\0') {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"<part> missing required attribute \'y\'","");
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"y","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[10])(atts,local_220);
    local_80 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var_13,iVar3));
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"name","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 == '\0') {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"<part> missing required attribute \'name\'","");
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"name","");
    local_88 = lVar6;
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[10])(atts,local_220);
    this_00 = &(this->temp_box).parts;
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
            ::find(&this_00->_M_t,(key_type *)CONCAT44(extraout_var_14,iVar3));
    if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((_Rb_tree_header *)cVar7._M_node !=
        &(this->temp_box).parts._M_t._M_impl.super__Rb_tree_header) {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"name","");
      iVar3 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,local_78);
      std::operator+(&local_a8,"<part> with name \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_18,iVar3));
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_220._0_8_ = *plVar10;
      pp_Var11 = (_func_int **)(plVar10 + 2);
      if ((_func_int **)local_220._0_8_ == pp_Var11) {
        local_210[0]._0_8_ = *pp_Var11;
        local_210[0]._8_8_ = plVar10[3];
        local_220._0_8_ = local_220 + 0x10;
      }
      else {
        local_210[0]._0_8_ = *pp_Var11;
      }
      local_220._8_8_ = plVar10[1];
      *plVar10 = (long)pp_Var11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = local_220 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"name","");
    lVar6 = local_88;
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[10])(atts,local_220);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
             ::operator[](this_00,(key_type *)CONCAT44(extraout_var_15,iVar3));
    (pmVar8->
    super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    ).data.data[0] = lVar6;
    (pmVar8->
    super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    ).data.data[1] = local_80;
  }
  else {
LAB_00201610:
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 != 0) goto LAB_002021a6;
    std::
    vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>::
    _M_erase_at_end(&(this->temp_image).boxes,
                    (this->temp_image).boxes.
                    super__Vector_base<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    pp_Var11 = (_func_int **)(local_220 + 0x10);
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"file","");
    iVar3 = (*(atts->
              super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_enumerable[9])(atts,local_220);
    if ((_func_int **)local_220._0_8_ != pp_Var11) {
      operator_delete((void *)local_220._0_8_);
    }
    if ((char)iVar3 == '\0') {
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      local_220._0_8_ = pp_Var11;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_220,"<image> missing required attribute \'file\'","");
      error::error(peVar9,(string *)local_220);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
    local_220._0_8_ = pp_Var11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"file","");
    (*(atts->
      super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._vptr_enumerable[10])(atts,local_220);
    std::__cxx11::string::_M_assign((string *)&this->temp_image);
  }
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_);
  }
LAB_002021a6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ts,name);
  return;
}

Assistant:

virtual void start_element ( 
                const unsigned long line_number,
                const std::string& name,
                const dlib::attribute_list& atts
            )
            {
                try
                {
                    if (ts.size() == 0) 
                    {
                        if (name != "dataset")
                        {
                            std::ostringstream sout;
                            sout << "Invalid XML document.  Root tag must be <dataset>.  Found <" << name << "> instead.";
                            throw dlib::error(sout.str());
                        }
                        else
                        {
                            ts.push_back(name);
                            return;
                        }
                    }


                    if (name == "box")
                    {
                        if (atts.is_in_list("top")) temp_box.rect.top() = sa = atts["top"];
                        else throw dlib::error("<box> missing required attribute 'top'");

                        if (atts.is_in_list("left")) temp_box.rect.left() = sa = atts["left"];
                        else throw dlib::error("<box> missing required attribute 'left'");

                        if (atts.is_in_list("width")) temp_box.rect.right() = sa = atts["width"];
                        else throw dlib::error("<box> missing required attribute 'width'");

                        if (atts.is_in_list("height")) temp_box.rect.bottom() = sa = atts["height"];
                        else throw dlib::error("<box> missing required attribute 'height'");

                        if (atts.is_in_list("difficult")) temp_box.difficult = sa = atts["difficult"];
                        if (atts.is_in_list("truncated")) temp_box.truncated = sa = atts["truncated"];
                        if (atts.is_in_list("occluded"))  temp_box.occluded  = sa = atts["occluded"];
                        if (atts.is_in_list("ignore"))  temp_box.ignore  = sa = atts["ignore"];
                        if (atts.is_in_list("angle"))  temp_box.angle  = sa = atts["angle"];
                        if (atts.is_in_list("age"))  temp_box.age  = sa = atts["age"];
                        if (atts.is_in_list("gender"))  
                        {
                            if (atts["gender"] == "male")
                                temp_box.gender = MALE;
                            else if (atts["gender"] == "female")
                                temp_box.gender = FEMALE;
                            else if (atts["gender"] == "unknown")
                                temp_box.gender = UNKNOWN;
                            else
                                throw dlib::error("Invalid gender string in box attribute.");
                        }
                        if (atts.is_in_list("pose"))  temp_box.pose  = sa = atts["pose"];
                        if (atts.is_in_list("detection_score"))  temp_box.detection_score  = sa = atts["detection_score"];

                        temp_box.rect.bottom() += temp_box.rect.top()-1;
                        temp_box.rect.right() += temp_box.rect.left()-1;
                    }
                    else if (name == "part" && ts.back() == "box")
                    {
                        point temp;
                        if (atts.is_in_list("x")) temp.x() = sa = atts["x"];
                        else throw dlib::error("<part> missing required attribute 'x'");

                        if (atts.is_in_list("y")) temp.y() = sa = atts["y"];
                        else throw dlib::error("<part> missing required attribute 'y'");

                        if (atts.is_in_list("name")) 
                        {
                            if (temp_box.parts.count(atts["name"])==0)
                            {
                                temp_box.parts[atts["name"]] = temp;
                            }
                            else
                            {
                                throw dlib::error("<part> with name '" + atts["name"] + "' is defined more than one time in a single box.");
                            }
                        }
                        else 
                        {
                            throw dlib::error("<part> missing required attribute 'name'");
                        }
                    }
                    else if (name == "image")
                    {
                        temp_image.boxes.clear();

                        if (atts.is_in_list("file")) temp_image.filename = atts["file"];
                        else throw dlib::error("<image> missing required attribute 'file'");
                    }

                    ts.push_back(name);
                }
                catch (error& e)
                {
                    throw dlib::error("Error on line " + cast_to_string(line_number) + ": " + e.what());
                }
            }